

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O3

bool __thiscall FIntermissionAction::ParseKey(FIntermissionAction *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FIntermissionPatch *pFVar4;
  
  bVar1 = FScanner::Compare(sc,"music");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x102);
    FString::operator=(&this->mMusic,sc->String);
    this->mMusicOrder = 0;
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if (bVar1) {
      FScanner::MustGetToken(sc,0x104);
      this->mMusicOrder = sc->Number;
    }
  }
  else {
    bVar1 = FScanner::Compare(sc,"cdmusic");
    if (bVar1) {
      FScanner::MustGetToken(sc,0x3d);
      FScanner::MustGetToken(sc,0x104);
      this->mCdTrack = sc->Number;
      this->mCdId = 0;
      bVar1 = FScanner::CheckToken(sc,0x2c);
      if (bVar1) {
        FScanner::MustGetToken(sc,0x104);
        this->mCdId = sc->Number;
      }
    }
    else {
      bVar1 = FScanner::Compare(sc,"Time");
      if (bVar1) {
        FScanner::MustGetToken(sc,0x3d);
        bVar1 = FScanner::CheckToken(sc,0x2d);
        if (bVar1) {
          FScanner::MustGetToken(sc,0x104);
          iVar2 = sc->Number;
        }
        else {
          FScanner::MustGetFloat(sc);
          iVar2 = (int)(sc->Float * 35.0);
        }
        this->mDuration = iVar2;
      }
      else {
        bVar1 = FScanner::Compare(sc,"Background");
        if (bVar1) {
          FScanner::MustGetToken(sc,0x3d);
          FScanner::MustGetToken(sc,0x102);
          FString::operator=(&this->mBackground,sc->String);
          this->mFlatfill = false;
          bVar1 = FScanner::CheckToken(sc,0x2c);
          if (!bVar1) {
            return true;
          }
          FScanner::MustGetToken(sc,0x104);
          this->mFlatfill = sc->Number != 0;
          bVar1 = FScanner::CheckToken(sc,0x2c);
          if (bVar1) {
            FScanner::MustGetToken(sc,0x102);
            FString::operator=(&this->mPalette,sc->String);
            return true;
          }
          return true;
        }
        bVar1 = FScanner::Compare(sc,"Sound");
        if (bVar1) {
          FScanner::MustGetToken(sc,0x3d);
          FScanner::MustGetToken(sc,0x102);
          FString::operator=(&this->mSound,sc->String);
        }
        else {
          bVar1 = FScanner::Compare(sc,"Draw");
          if (bVar1) {
            uVar3 = TArray<FIntermissionPatch,_FIntermissionPatch>::Reserve(&this->mOverlays,1);
            pFVar4 = (this->mOverlays).Array;
            FScanner::MustGetToken(sc,0x3d);
            FScanner::MustGetToken(sc,0x102);
            pFVar4 = pFVar4 + uVar3;
            FString::operator=(&pFVar4->mName,sc->String);
            FScanner::MustGetToken(sc,0x2c);
            FScanner::MustGetToken(sc,0x104);
            pFVar4->x = (double)sc->Number;
            FScanner::MustGetToken(sc,0x2c);
            FScanner::MustGetToken(sc,0x104);
            pFVar4->y = (double)sc->Number;
            (pFVar4->mCondition).Index = 0;
          }
          else {
            bVar1 = FScanner::Compare(sc,"DrawConditional");
            if (!bVar1) {
              return false;
            }
            uVar3 = TArray<FIntermissionPatch,_FIntermissionPatch>::Reserve(&this->mOverlays,1);
            pFVar4 = (this->mOverlays).Array;
            FScanner::MustGetToken(sc,0x3d);
            FScanner::MustGetToken(sc,0x102);
            iVar2 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
            pFVar4 = pFVar4 + uVar3;
            (pFVar4->mCondition).Index = iVar2;
            FScanner::MustGetToken(sc,0x2c);
            FScanner::MustGetToken(sc,0x102);
            FString::operator=(&pFVar4->mName,sc->String);
            FScanner::MustGetToken(sc,0x2c);
            FScanner::MustGetToken(sc,0x104);
            pFVar4->x = (double)sc->Number;
            FScanner::MustGetToken(sc,0x2c);
            FScanner::MustGetToken(sc,0x104);
            pFVar4->y = (double)sc->Number;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool FIntermissionAction::ParseKey(FScanner &sc)
{
	if (sc.Compare("music"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mMusic = sc.String;
		mMusicOrder = 0;
		if (sc.CheckToken(','))
		{
			sc.MustGetToken(TK_IntConst);
			mMusicOrder = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("cdmusic"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_IntConst);
		mCdTrack = sc.Number;
		mCdId = 0;
		if (sc.CheckToken(','))
		{
			sc.MustGetToken(TK_IntConst);
			mCdId = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("Time"))
	{
		sc.MustGetToken('=');
		if (!sc.CheckToken('-'))
		{
			sc.MustGetFloat();
			mDuration = int(sc.Float*TICRATE);
		}
		else
		{
			sc.MustGetToken(TK_IntConst);
			mDuration = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("Background"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mBackground = sc.String;
		mFlatfill = 0;
		if (sc.CheckToken(','))
		{
			sc.MustGetToken(TK_IntConst);
			mFlatfill = !!sc.Number;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_StringConst);
				mPalette = sc.String;
			}
		}
		return true;
	}
	else if (sc.Compare("Sound"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mSound = sc.String;
		return true;
	}
	else if (sc.Compare("Draw"))
	{
		FIntermissionPatch *pat = &mOverlays[mOverlays.Reserve(1)];
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		pat->mName = sc.String;
		sc.MustGetToken(',');
		sc.MustGetToken(TK_IntConst);
		pat->x = sc.Number;
		sc.MustGetToken(',');
		sc.MustGetToken(TK_IntConst);
		pat->y = sc.Number;
		pat->mCondition = NAME_None;
		return true;
	}
	else if (sc.Compare("DrawConditional"))
	{
		FIntermissionPatch *pat = &mOverlays[mOverlays.Reserve(1)];
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		pat->mCondition = sc.String;
		sc.MustGetToken(',');
		sc.MustGetToken(TK_StringConst);
		pat->mName = sc.String;
		sc.MustGetToken(',');
		sc.MustGetToken(TK_IntConst);
		pat->x = sc.Number;
		sc.MustGetToken(',');
		sc.MustGetToken(TK_IntConst);
		pat->y = sc.Number;
		return true;
	}
	else return false;
}